

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuBuffer.H
# Opt level: O0

int * __thiscall amrex::Gpu::Buffer<int,_0>::copyToHost(Buffer<int,_0> *this)

{
  Buffer<int,_0> *this_local;
  
  return this->h_data;
}

Assistant:

T* copyToHost ()
    {
#ifdef AMREX_USE_GPU
        if (d_data)
        {
            Gpu::dtoh_memcpy_async(h_data, d_data, m_size*sizeof(T));
            Gpu::streamSynchronize();
        }
#endif
        return h_data;
    }